

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser2_syntax.c
# Opt level: O0

RK_S32 h265d_syntax_fill_slice(void *ctx,RK_S32 input_index)

{
  uint uVar1;
  MPP_RET MVar2;
  size_t sVar3;
  void *pvVar4;
  uint local_e0;
  RK_S32 local_dc;
  RK_S32 _out_1;
  RK_S32 _out;
  RK_U32 nal_type;
  RK_S32 value;
  BitReadCtx_t *gb;
  BitReadCtx_t gb_cxt;
  int local_68;
  RK_S32 buff_size;
  RK_U32 length;
  RK_U32 size;
  RK_U8 *current;
  RK_U8 *ptr;
  int local_48;
  RK_U32 position;
  RK_S32 count;
  RK_S32 i;
  MppBuffer streambuf;
  h265d_dxva2_picture_context_t *ctx_pic;
  HEVCContext *h;
  H265dContext_t *h265dctx;
  void *pvStack_18;
  RK_S32 input_index_local;
  void *ctx_local;
  
  ctx_pic = *ctx;
  streambuf = *(MppBuffer *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].s1_used_flag + 6);
  _count = (MppBuffer)0x0;
  local_48 = 0;
  ptr._4_4_ = 0;
  current = (RK_U8 *)0x0;
  local_68 = 0;
  h = (HEVCContext *)ctx;
  h265dctx._4_4_ = input_index;
  pvStack_18 = ctx;
  if (input_index == -1) {
    gb_cxt.update_curbyte._4_4_ = 0;
    _length = (RK_U8 *)mpp_packet_get_data(*(MppPacket *)
                                            (ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 0xf));
    sVar3 = mpp_packet_get_size(*(MppPacket *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 0xf)
                               );
    for (position = 0; (int)position < *(int *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 9);
        position = position + 1) {
      local_68 = *(int *)(*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                          (long)(int)position * 0x18 + 0xc) + 4 + local_68;
    }
    uVar1 = local_68 + 0xfU & 0xfffffff0;
    if ((uint)sVar3 < uVar1 + 0x40) {
      mpp_osal_free("h265d_syntax_fill_slice",_length);
      gb_cxt.update_curbyte._4_4_ = uVar1 + 0x2c3f & 0xfffffc00;
      _length = (RK_U8 *)mpp_osal_malloc("h265d_syntax_fill_slice",
                                         (long)(int)gb_cxt.update_curbyte._4_4_);
      mpp_packet_set_data(*(MppPacket *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 0xf),
                          _length);
      mpp_packet_set_size(*(MppPacket *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 0xf),
                          (long)(int)gb_cxt.update_curbyte._4_4_);
    }
  }
  else {
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 7),input_index,
               SLOT_BUFFER,&count);
    _length = (RK_U8 *)mpp_buffer_get_ptr_with_caller(_count,"h265d_syntax_fill_slice");
    current = _length;
    if (_length == (RK_U8 *)0x0) {
      return -3;
    }
  }
  if (*(int *)((long)streambuf + 0x1e78) < *(int *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 9)
     ) {
    if (*(long *)((long)streambuf + 0x1e58) != 0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)((long)streambuf + 0x1e58));
    }
    *(undefined8 *)((long)streambuf + 0x1e58) = 0;
    pvVar4 = mpp_osal_malloc("h265d_syntax_fill_slice",
                             (long)*(int *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 9) * 0xc);
    *(void **)((long)streambuf + 0x1e58) = pvVar4;
    if (*(long *)((long)streambuf + 0x1e58) == 0) {
      return -0x3ee;
    }
    if (*(long *)((long)streambuf + 0x1e70) != 0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)((long)streambuf + 0x1e70));
    }
    *(undefined8 *)((long)streambuf + 0x1e70) = 0;
    pvVar4 = mpp_osal_malloc("h265d_syntax_fill_slice",
                             (long)*(int *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 9) * 0xc);
    *(void **)((long)streambuf + 0x1e70) = pvVar4;
    if (*(long *)((long)streambuf + 0x1e70) == 0) {
      return -0x3ee;
    }
    *(undefined4 *)((long)streambuf + 0x1e78) =
         *(undefined4 *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 9);
  }
  position = 0;
  while( true ) {
    if (*(int *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 9) <= (int)position) {
      *(int *)((long)streambuf + 0x1e54) = local_48;
      *(uint *)((long)streambuf + 0x1e68) = ptr._4_4_;
      if (h265dctx._4_4_ == -1) {
        *(undefined8 *)((long)streambuf + 0x1e60) = 0;
        mpp_packet_set_length
                  (*(MppPacket *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 0xf),
                   (ulong)ptr._4_4_);
      }
      else {
        *(RK_U8 **)((long)streambuf + 0x1e60) = current;
        mpp_buf_slot_set_flag
                  (*(MppBufSlots *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 7),
                   h265dctx._4_4_,SLOT_CODEC_READY);
        mpp_buf_slot_set_flag
                  (*(MppBufSlots *)(ctx_pic[0x13].pp.sps_st_rps[0x2f].delta_poc_s1 + 7),
                   h265dctx._4_4_,SLOT_HAL_INPUT);
      }
      return 0;
    }
    mpp_set_bitread_ctx((BitReadCtx_t *)&gb,
                        *(RK_U8 **)
                         (*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                          (long)(int)position * 0x18 + 0x10),
                        *(RK_S32 *)
                         (*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                          (long)(int)position * 0x18 + 0xc));
    mpp_set_bitread_pseudo_code_type((BitReadCtx_t *)&gb,PSEUDO_CODE_H264_H265);
    _nal_type = (BitReadCtx_t *)&gb;
    MVar2 = mpp_read_bits(_nal_type,1,&local_dc);
    _nal_type->ret = MVar2;
    if (_nal_type->ret != MPP_OK) break;
    _out = local_dc;
    MVar2 = mpp_read_bits(_nal_type,6,(RK_S32 *)&local_e0);
    _nal_type->ret = MVar2;
    if (_nal_type->ret != MPP_OK) {
      return -0x3ec;
    }
    _out_1 = local_e0;
    if (local_e0 < 0x20) {
      _length[0] = '\0';
      _length[1] = '\0';
      _length[2] = '\x01';
      memcpy(_length + 3,
             *(void **)(*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                        (long)(int)position * 0x18 + 0x10),
             (long)*(int *)(*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                            (long)(int)position * 0x18 + 0xc));
      fill_slice_short((DXVA_Slice_HEVC_Short *)
                       (*(long *)((long)streambuf + 0x1e58) + (long)local_48 * 0xc),ptr._4_4_ + 3,
                       *(uint *)(*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                                 (long)(int)position * 0x18 + 0xc));
      init_slice_cut_param
                ((DXVA_Slice_HEVC_Cut_Param *)
                 (*(long *)((long)streambuf + 0x1e70) + (long)local_48 * 0xc));
      _length = _length + 3 +
                *(int *)(*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                         (long)(int)position * 0x18 + 0xc);
      ptr._4_4_ = *(int *)(*(long *)((ctx_pic->pp).sps_st_rps[0x29].delta_poc_s1 + 5) +
                           (long)(int)position * 0x18 + 0xc) + ptr._4_4_ + 3;
      local_48 = local_48 + 1;
    }
    position = position + 1;
  }
  return -0x3ec;
}

Assistant:

RK_S32 h265d_syntax_fill_slice(void *ctx, RK_S32 input_index)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    const HEVCContext *h = (const HEVCContext *)h265dctx->priv_data;
    h265d_dxva2_picture_context_t *ctx_pic = (h265d_dxva2_picture_context_t *)h->hal_pic_private;
    MppBuffer streambuf = NULL;
    RK_S32 i, count = 0;
    RK_U32 position = 0;
    RK_U8 *ptr = NULL;
    RK_U8 *current = NULL;
    RK_U32 size = 0, length = 0;
    // mpp_err("input_index = %d",input_index);
    if (-1 != input_index) {
        mpp_buf_slot_get_prop(h->packet_slots, input_index, SLOT_BUFFER, &streambuf);
        current = ptr = (RK_U8 *)mpp_buffer_get_ptr(streambuf);
        if (current == NULL) {
            return MPP_ERR_NULL_PTR;
        }
    } else {
        RK_S32 buff_size = 0;
        current = (RK_U8 *)mpp_packet_get_data(h->input_packet);
        size = (RK_U32)mpp_packet_get_size(h->input_packet);
        for (i = 0; i < h->nb_nals; i++) {
            length += h->nals[i].size + 4;
        }
        length = MPP_ALIGN(length, 16) + 64;
        if (length > size) {
            mpp_free(current);
            buff_size = MPP_ALIGN(length + 10 * 1024, 1024);
            current = mpp_malloc(RK_U8, buff_size);
            mpp_packet_set_data(h->input_packet, (void*)current);
            mpp_packet_set_size(h->input_packet, buff_size);
        }
    }
    if (ctx_pic->max_slice_num < h->nb_nals) {

        MPP_FREE(ctx_pic->slice_short);

        ctx_pic->slice_short = (DXVA_Slice_HEVC_Short *)mpp_malloc(DXVA_Slice_HEVC_Short, h->nb_nals);
        if (!ctx_pic->slice_short)
            return MPP_ERR_NOMEM;

        MPP_FREE(ctx_pic->slice_cut_param);

        ctx_pic->slice_cut_param = (DXVA_Slice_HEVC_Cut_Param *)mpp_malloc(DXVA_Slice_HEVC_Cut_Param, h->nb_nals);
        if (!ctx_pic->slice_cut_param)
            return MPP_ERR_NOMEM;

        ctx_pic->max_slice_num = h->nb_nals;
    }
    for (i = 0; i < h->nb_nals; i++) {
        static const RK_U8 start_code[] = {0, 0, 1 };
        static const RK_U32 start_code_size = sizeof(start_code);
        BitReadCtx_t gb_cxt, *gb;
        RK_S32 value;
        RK_U32 nal_type;

        mpp_set_bitread_ctx(&gb_cxt, (RK_U8 *)h->nals[i].data,
                            h->nals[i].size);
        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);

        gb = &gb_cxt;

        READ_ONEBIT(gb, &value); /*this bit should be zero*/

        READ_BITS(gb, 6, &nal_type);

        if (nal_type >= 32) {
            continue;
        }
        memcpy(current, start_code, start_code_size);
        current += start_code_size;
        position += start_code_size;
        memcpy(current, h->nals[i].data, h->nals[i].size);
        // mpp_log("h->nals[%d].size = %d", i, h->nals[i].size);
        fill_slice_short(&ctx_pic->slice_short[count], position, h->nals[i].size);
        init_slice_cut_param(&ctx_pic->slice_cut_param[count]);
        current += h->nals[i].size;
        position += h->nals[i].size;
        count++;
    }
    ctx_pic->slice_count    = count;
    ctx_pic->bitstream_size = position;
    if (-1 != input_index) {
        ctx_pic->bitstream      = (RK_U8*)ptr;

        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_HAL_INPUT);
    } else {
        ctx_pic->bitstream = NULL;
        mpp_packet_set_length(h->input_packet, position);
    }
    return MPP_OK;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}